

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O0

void __thiscall
helics::Translator::setOperator(Translator *this,shared_ptr<helics::TranslatorOperator> *operation)

{
  bool bVar1;
  __shared_ptr *in_RSI;
  shared_ptr<helics::TranslatorOperator> *in_RDI;
  shared_ptr<helics::CustomTranslatorOperation> *in_stack_ffffffffffffff78;
  shared_ptr<helics::TranslatorOperations> *in_stack_ffffffffffffff80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffb8;
  Translator *in_stack_ffffffffffffffc0;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    std::make_shared<helics::CustomTranslatorOperation,std::shared_ptr<helics::TranslatorOperator>>
              (in_RDI);
    std::shared_ptr<helics::TranslatorOperations>::
    shared_ptr<helics::CustomTranslatorOperation,void>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    setTranslatorOperations
              (in_stack_ffffffffffffffc0,
               (shared_ptr<helics::TranslatorOperations> *)in_stack_ffffffffffffffb8._M_pi);
    std::shared_ptr<helics::TranslatorOperations>::~shared_ptr
              ((shared_ptr<helics::TranslatorOperations> *)0x31ca71);
    std::shared_ptr<helics::CustomTranslatorOperation>::~shared_ptr
              ((shared_ptr<helics::CustomTranslatorOperation> *)0x31ca7b);
  }
  else {
    std::shared_ptr<helics::TranslatorOperations>::shared_ptr
              ((shared_ptr<helics::TranslatorOperations> *)&stack0xffffffffffffffb0,
               in_stack_ffffffffffffff78);
    setTranslatorOperations
              (in_stack_ffffffffffffffc0,
               (shared_ptr<helics::TranslatorOperations> *)in_stack_ffffffffffffffb8._M_pi);
    std::shared_ptr<helics::TranslatorOperations>::~shared_ptr
              ((shared_ptr<helics::TranslatorOperations> *)0x31cacf);
  }
  return;
}

Assistant:

void Translator::setOperator(std::shared_ptr<TranslatorOperator> operation)
{
    if (operation) {
        setTranslatorOperations(std::make_shared<CustomTranslatorOperation>(std::move(operation)));
    } else {
        setTranslatorOperations(nullptr);
    }
}